

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Node * prvTidyGetToken(TidyDocImpl *doc,GetTokenMode mode)

{
  uint *puVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  char cVar11;
  TidyTagId TVar12;
  int iVar13;
  Lexer *lexer_00;
  ctmbstr ptVar14;
  Dict *pDVar15;
  GetTokenMode GVar16;
  tmbchar tVar17;
  uint uVar18;
  int iVar19;
  Bool BVar20;
  uint uVar21;
  uint uVar22;
  Node *pNVar23;
  Node *pNVar24;
  tmbstr ptVar25;
  AttVal *pAVar26;
  tmbstr ptVar27;
  Attribute *pAVar28;
  AttVal *pAVar29;
  undefined8 uVar30;
  AttVal *pAVar31;
  AttVal *pAVar32;
  uint uVar33;
  Lexer *lexer;
  StreamIn *pSVar34;
  ulong uVar35;
  ulong uVar36;
  Lexer *lexer_7;
  Lexer *lexer_2;
  Lexer *pLVar37;
  Lexer *lexer_1;
  bool bVar38;
  Bool isempty;
  Node *php;
  Node *asp;
  int local_78;
  int local_74;
  undefined1 local_70 [36];
  uint uStack_4c;
  undefined4 local_48;
  int local_44;
  Node *local_40;
  Node *local_38;
  
  lexer_00 = doc->lexer;
  pNVar23 = lexer_00->itoken;
  if (lexer_00->pushed != no) {
    if (pNVar23 != (Node *)0x0) {
      lexer_00->pushed = no;
      return pNVar23;
    }
LAB_0014420d:
    lexer_00->pushed = no;
    pNVar23 = lexer_00->token;
    if (pNVar23->type != TextNode) {
      return pNVar23;
    }
    if ((lexer_00->insert == (IStack *)0x0) && (lexer_00->inode == (Node *)0x0)) {
      return pNVar23;
    }
    pNVar23 = prvTidyInsertedToken(doc);
    lexer_00->itoken = pNVar23;
    return pNVar23;
  }
  if (pNVar23 != (Node *)0x0) {
    lexer_00->itoken = (Node *)0x0;
    goto LAB_0014420d;
  }
  if (((lexer_00->insert != (IStack *)0x0) || (lexer_00->inode != (Node *)0x0)) &&
     (lexer_00->istacksize != 0)) {
    pNVar23 = prvTidyInsertedToken(doc);
LAB_00144272:
    lexer_00->token = pNVar23;
    return pNVar23;
  }
  if (mode == CdataContent) {
    pNVar23 = lexer_00->parent;
    if (pNVar23 == (Node *)0x0) {
      __assert_fail("lexer->parent != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/lexer.c"
                    ,0x9bf,"Node *prvTidyGetToken(TidyDocImpl *, GetTokenMode)");
    }
    local_70._16_8_ = prvTidyAttrGetById(pNVar23,TidyAttr_SRC);
    if ((pNVar23->tag == (Dict *)0x0) ||
       ((TVar12 = pNVar23->tag->id, TVar12 != TidyTag_STYLE && (TVar12 != TidyTag_SCRIPT)))) {
      stack0xffffffffffffffb0 = (Lexer *)((ulong)uStack_4c << 0x20);
    }
    else {
      stack0xffffffffffffffb0 =
           (Lexer *)CONCAT44(uStack_4c,
                             CONCAT31((int3)(TVar12 >> 8),*(int *)((doc->config).value + 0x4f) != 0)
                            );
    }
    pSVar34 = doc->docIn;
    uVar3 = pSVar34->curcol;
    uVar7 = pSVar34->curline;
    lexer_00->lines = uVar7;
    lexer_00->columns = uVar3;
    lexer_00->waswhite = no;
    lexer_00->txtend = lexer_00->lexsize;
    lexer_00->txtstart = lexer_00->lexsize;
    uVar18 = prvTidyReadChar(pSVar34);
    if (uVar18 != 0xffffffff) {
      bVar38 = true;
      uVar35 = 0;
      iVar19 = 0;
      local_74 = 0;
      do {
        prvTidyAddCharToLexer(lexer_00,uVar18);
        lexer_00->txtend = lexer_00->lexsize;
        uVar33 = (uint)uVar35;
        if (iVar19 == 1) {
          if ((uVar18 < 0x80) && (iVar19 = 1, (lexmap[uVar18] & 2) != 0)) goto LAB_00144617;
          ptVar14 = pNVar23->element;
          ptVar25 = lexer_00->lexbuf;
          uVar18 = prvTidytmbstrlen(ptVar14);
          iVar19 = prvTidytmbstrncasecmp(ptVar14,ptVar25 + uVar35,uVar18);
          local_74 = local_74 + (uint)(((byte)stack0xffffffffffffffb0 ^ 1) & iVar19 == 0);
LAB_00144614:
          iVar19 = 0;
        }
        else if (iVar19 == 0) {
          if (uVar18 == 0x3c) {
            uVar18 = prvTidyReadChar(doc->docIn);
            if ((0x7f < uVar18) || ((lexmap[uVar18] & 2) == 0)) {
              if (uVar18 == 0x5c) {
                prvTidyAddCharToLexer(lexer_00,0x5c);
                uVar18 = prvTidyReadChar(doc->docIn);
                if (uVar18 == 0x2f) {
                  prvTidyAddCharToLexer(lexer_00,0x2f);
                  iVar19 = 0;
                  if (local_70[0x20] == '\0') {
                    uVar18 = prvTidyReadChar(doc->docIn);
                    if ((uVar18 < 0x80) && ((lexmap[uVar18] & 2) != 0)) goto LAB_001443eb;
                    prvTidyUngetChar(uVar18,doc->docIn);
                  }
                  goto LAB_00144617;
                }
              }
              else if (uVar18 == 0x2f) {
                prvTidyAddCharToLexer(lexer_00,0x2f);
                uVar18 = prvTidyReadChar(doc->docIn);
                if ((uVar18 < 0x80) && ((lexmap[uVar18] & 2) != 0)) {
LAB_001443eb:
                  prvTidyUngetChar(uVar18,doc->docIn);
                  uVar35 = (ulong)lexer_00->lexsize;
                  iVar19 = 2;
                  goto LAB_00144617;
                }
              }
              prvTidyUngetChar(uVar18,doc->docIn);
              goto LAB_00144614;
            }
            if (((bVar38 && (Node *)local_70._16_8_ != (Node *)0x0) && (pNVar23->tag != (Dict *)0x0)
                ) && (pNVar23->tag->id == TidyTag_SCRIPT)) {
              lexer_00->lexsize = lexer_00->txtstart;
              prvTidyUngetChar(uVar18,doc->docIn);
              prvTidyUngetChar(0x3c,doc->docIn);
              return (Node *)0x0;
            }
            prvTidyAddCharToLexer(lexer_00,uVar18);
            uVar35 = (ulong)(lexer_00->lexsize - 1);
            iVar19 = 1;
          }
          else {
            iVar19 = 0;
            if (((!bVar38) || (0x7f < uVar18)) || (bVar38 = true, (lexmap[uVar18] & 8) == 0)) {
              bVar38 = false;
            }
          }
        }
        else if ((0x7f < uVar18) || (iVar19 = 2, (lexmap[uVar18] & 2) == 0)) {
          ptVar14 = pNVar23->element;
          ptVar25 = lexer_00->lexbuf;
          uVar18 = prvTidytmbstrlen(ptVar14);
          iVar19 = prvTidytmbstrncasecmp(ptVar14,ptVar25 + uVar35,uVar18);
          if ((bVar38) && (iVar19 != 0)) {
            uVar18 = lexer_00->lexsize;
            while (uVar18 = uVar18 - 1, uVar33 <= uVar18) {
              prvTidyUngetChar((int)lexer_00->lexbuf[uVar18],doc->docIn);
            }
            prvTidyUngetChar(0x2f,doc->docIn);
            prvTidyUngetChar(0x3c,doc->docIn);
LAB_00145472:
            lexer_00->txtstart = lexer_00->txtend;
            lexer_00->lexsize = lexer_00->txtend;
            goto LAB_001453c8;
          }
          if (iVar19 == 0) {
            if (local_74 < 1) {
              uVar18 = lexer_00->lexsize;
              while (uVar18 = uVar18 - 1, uVar33 <= uVar18) {
                prvTidyUngetChar((int)lexer_00->lexbuf[uVar18],doc->docIn);
              }
              prvTidyUngetChar(0x2f,doc->docIn);
              prvTidyUngetChar(0x3c,doc->docIn);
              lexer_00->lexsize = uVar33 - 2;
              if (!bVar38) {
                lexer_00->txtend = lexer_00->lexsize;
                goto LAB_001453c8;
              }
              goto LAB_00145472;
            }
            local_74 = local_74 + -1;
          }
          iVar19 = 0;
          if (lexer_00->lexbuf[uVar33 - 2] != '\\') {
            iVar13 = doc->docIn->curcol;
            lexer_00->lines = doc->docIn->curline;
            lexer_00->columns = iVar13 - 3;
            BVar20 = prvTidyIsJavaScript(pNVar23);
            if (((BVar20 != no) && (*(int *)((doc->config).value + 0x1a) != 0)) &&
               (BVar20 = prvTidyIsHTML5Mode(doc), BVar20 == no)) {
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x22c);
              uVar36 = (ulong)lexer_00->lexsize;
              uVar33 = uVar33 - 1;
              if (uVar33 < lexer_00->lexsize) {
                do {
                  lexer_00->lexbuf[uVar36] = lexer_00->lexbuf[uVar36 - 1];
                  uVar36 = uVar36 - 1;
                } while (uVar33 < uVar36);
              }
              lexer_00->lexbuf[uVar33] = '\\';
              lexer_00->lexsize = lexer_00->lexsize + 1;
            }
          }
        }
LAB_00144617:
        uVar18 = prvTidyReadChar(doc->docIn);
      } while (uVar18 != 0xffffffff);
      if (!bVar38) {
        lexer_00->txtend = lexer_00->lexsize;
        goto LAB_001453b4;
      }
    }
    lexer_00->txtstart = lexer_00->txtend;
    lexer_00->lexsize = lexer_00->txtend;
LAB_001453b4:
    prvTidyReport(doc,pNVar23,(Node *)0x0,0x25a);
LAB_001453c8:
    pNVar23 = (Node *)(*lexer_00->allocator->vtbl->alloc)(lexer_00->allocator,0x70);
    pNVar23->parent = (Node *)0x0;
    pNVar23->prev = (Node *)0x0;
    pNVar23->next = (Node *)0x0;
    pNVar23->content = (Node *)0x0;
    pNVar23->last = (Node *)0x0;
    pNVar23->attributes = (AttVal *)0x0;
    pNVar23->was = (Dict *)0x0;
    pNVar23->tag = (Dict *)0x0;
    pNVar23->element = (tmbstr)0x0;
    pNVar23->start = 0;
    pNVar23->end = 0;
    pNVar23->type = RootNode;
    pNVar23->line = 0;
    pNVar23->column = 0;
    pNVar23->idx = 0;
    pNVar23->closed = no;
    pNVar23->implicit = no;
    pNVar23->linebreak = no;
    *(undefined4 *)&pNVar23->field_0x6c = 0;
    uVar18 = lexer_00->columns;
    pNVar23->line = lexer_00->lines;
    pNVar23->column = uVar18;
    pNVar23->type = TextNode;
    uVar18 = lexer_00->txtend;
    pNVar23->start = lexer_00->txtstart;
    pNVar23->end = uVar18;
    return pNVar23;
  }
  local_70._28_4_ = 0;
  local_70._0_8_ = (AttVal *)0x0;
  iVar19 = *(int *)((doc->config).value + 0x1c);
  if (iVar19 == 1) {
    bVar38 = true;
  }
  else if (iVar19 == 0) {
    bVar38 = false;
  }
  else {
    uVar33 = prvTidyHTMLVersion(doc);
    bVar38 = (uVar33 >> 0x11 & 1) == 0;
  }
  lexer_00->token = (Node *)0x0;
  pSVar34 = doc->docIn;
  uVar4 = pSVar34->curcol;
  uVar8 = pSVar34->curline;
  lexer_00->lines = uVar8;
  lexer_00->columns = uVar4;
  lexer_00->waswhite = no;
  lexer_00->txtend = lexer_00->lexsize;
  lexer_00->txtstart = lexer_00->lexsize;
  uVar33 = prvTidyReadChar(pSVar34);
  if (uVar33 == 0xffffffff) {
LAB_00145260:
    if (lexer_00->state == LEX_COMMENT) {
      prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x251);
      lexer_00->txtend = lexer_00->lexsize;
      lexer_00->lexbuf[lexer_00->lexsize] = '\0';
      lexer_00->state = LEX_CONTENT;
      lexer_00->waswhite = no;
      pLVar37 = doc->lexer;
      pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
      pNVar23->parent = (Node *)0x0;
      pNVar23->prev = (Node *)0x0;
      pNVar23->next = (Node *)0x0;
      pNVar23->content = (Node *)0x0;
      pNVar23->last = (Node *)0x0;
      pNVar23->attributes = (AttVal *)0x0;
      pNVar23->was = (Dict *)0x0;
      pNVar23->tag = (Dict *)0x0;
      pNVar23->element = (tmbstr)0x0;
      pNVar23->start = 0;
      pNVar23->end = 0;
      pNVar23->type = RootNode;
      pNVar23->line = 0;
      pNVar23->column = 0;
      pNVar23->idx = 0;
      pNVar23->closed = no;
      pNVar23->implicit = no;
      pNVar23->linebreak = no;
      *(undefined4 *)&pNVar23->field_0x6c = 0;
      uVar18 = pLVar37->columns;
      pNVar23->line = pLVar37->lines;
      pNVar23->column = uVar18;
      pNVar23->type = CommentTag;
LAB_0014539f:
      uVar30._0_4_ = pLVar37->txtstart;
      uVar30._4_4_ = pLVar37->txtend;
    }
    else {
      if ((lexer_00->state != LEX_CONTENT) ||
         (lexer_00->txtend = lexer_00->lexsize, lexer_00->lexsize <= lexer_00->txtstart)) {
        if ((AttVal *)local_70._0_8_ != (AttVal *)0x0) {
          prvTidyFreeAttribute(doc,(AttVal *)local_70._0_8_);
        }
        return (Node *)0x0;
      }
      prvTidyUngetChar(0xffffffff,doc->docIn);
      uVar33 = lexer_00->lexsize - 1;
      if (lexer_00->lexbuf[uVar33] == ' ') {
        lexer_00->lexsize = uVar33;
        lexer_00->txtend = uVar33;
      }
      pNVar23 = (Node *)(*lexer_00->allocator->vtbl->alloc)(lexer_00->allocator,0x70);
      pNVar23->parent = (Node *)0x0;
      pNVar23->prev = (Node *)0x0;
      pNVar23->next = (Node *)0x0;
      pNVar23->content = (Node *)0x0;
      pNVar23->last = (Node *)0x0;
      pNVar23->attributes = (AttVal *)0x0;
      pNVar23->was = (Dict *)0x0;
      pNVar23->tag = (Dict *)0x0;
      pNVar23->element = (tmbstr)0x0;
      pNVar23->start = 0;
      pNVar23->end = 0;
      pNVar23->type = RootNode;
      pNVar23->line = 0;
      pNVar23->column = 0;
      pNVar23->idx = 0;
      pNVar23->closed = no;
      pNVar23->implicit = no;
      pNVar23->linebreak = no;
      *(undefined4 *)&pNVar23->field_0x6c = 0;
      uVar18 = lexer_00->columns;
      pNVar23->line = lexer_00->lines;
      pNVar23->column = uVar18;
      pNVar23->type = TextNode;
      uVar30._0_4_ = lexer_00->txtstart;
      uVar30._4_4_ = lexer_00->txtend;
    }
    pNVar23->start = (int)uVar30;
    pNVar23->end = (int)((ulong)uVar30 >> 0x20);
    lexer_00->token = pNVar23;
    return pNVar23;
  }
  local_78 = 0;
  pNVar23 = (Node *)0x0;
LAB_001446ee:
  if (lexer_00->insertspace != no) {
    prvTidyAddCharToLexer(lexer_00,0x20);
    lexer_00->waswhite = yes;
    lexer_00->insertspace = no;
  }
  if (mode == Preformatted && uVar33 == 0xa0) {
    uVar33 = 0x20;
  }
  prvTidyAddCharToLexer(lexer_00,uVar33);
  switch(lexer_00->state) {
  case LEX_CONTENT:
    if (uVar33 < 0x80) {
      if (((mode == IgnoreWhitespace & (byte)lexmap[uVar33] >> 3) == 1) &&
         (lexer_00->lexsize == lexer_00->txtstart + 1)) {
        lexer_00->lexsize = lexer_00->lexsize - 1;
        lexer_00->waswhite = no;
        uVar5 = doc->docIn->curcol;
        uVar9 = doc->docIn->curline;
        lexer_00->lines = uVar9;
        lexer_00->columns = uVar5;
LAB_001447ac:
        mode = IgnoreWhitespace;
      }
      else if (uVar33 == 0x3c) {
        lexer_00->state = LEX_GT;
      }
      else {
        if ((lexmap[uVar33] & 8) == 0) {
          if (mode != IgnoreMarkup && uVar33 == 0x26) {
            ParseEntity(doc,mode);
          }
          goto LAB_00144def;
        }
        if (lexer_00->waswhite == no) {
          lexer_00->waswhite = yes;
          if (((mode - OtherNamespace < 0xfffffffe) && (uVar33 != 0x20)) && (lexer_00->lexsize != 0)
             ) {
            lexer_00->lexbuf[lexer_00->lexsize - 1] = ' ';
          }
        }
        else if (mode - OtherNamespace < 0xfffffffe) {
          lexer_00->lexsize = lexer_00->lexsize - 1;
          uVar6 = doc->docIn->curcol;
          uVar10 = doc->docIn->curline;
          lexer_00->lines = uVar10;
          lexer_00->columns = uVar6;
        }
      }
    }
    else {
LAB_00144def:
      mode = mode + (mode == IgnoreWhitespace);
      lexer_00->waswhite = no;
    }
    break;
  case LEX_GT:
    if (uVar33 == 0x2f) {
      uVar18 = prvTidyReadChar(doc->docIn);
      if (uVar18 == 0xffffffff) {
        prvTidyUngetChar(0xffffffff,doc->docIn);
      }
      else {
        prvTidyAddCharToLexer(lexer_00,uVar18);
        if (((uVar18 < 0x80) && ((lexmap[uVar18] & 2) != 0)) ||
           ((*(int *)((doc->config).value + 0x67) != 0 &&
            (BVar20 = prvTidyIsXMLNamechar(uVar18), BVar20 != no)))) {
          uVar21 = lexer_00->lexsize - 3;
          lexer_00->lexsize = uVar21;
          lexer_00->txtend = uVar21;
          prvTidyUngetChar(uVar18,doc->docIn);
          lexer_00->state = LEX_ENDTAG;
          lexer_00->lexbuf[lexer_00->lexsize] = '\0';
          piVar2 = &doc->docIn->curcol;
          *piVar2 = *piVar2 + -2;
          if (lexer_00->txtstart < lexer_00->txtend) {
            if ((mode == IgnoreWhitespace) &&
               (uVar33 = lexer_00->lexsize - 1, lexer_00->lexbuf[uVar33] == ' ')) {
              lexer_00->lexsize = uVar33;
              lexer_00->txtend = uVar33;
            }
            goto LAB_00145ef3;
          }
        }
        else {
          lexer_00->waswhite = no;
          lexer_00->state = LEX_CONTENT;
        }
      }
    }
    else if (mode == IgnoreMarkup) {
      lexer_00->waswhite = no;
      lexer_00->state = LEX_CONTENT;
      mode = IgnoreMarkup;
    }
    else {
      if ((int)uVar33 < 0x25) {
        if (uVar33 == 0x21) {
          uVar18 = prvTidyReadChar(doc->docIn);
          if (uVar18 == 0x2d) {
            uVar18 = prvTidyReadChar(doc->docIn);
            if (uVar18 != 0x2d) {
LAB_00145209:
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x250);
              do {
                uVar18 = prvTidyReadChar(doc->docIn);
                if (uVar18 == 0x3e) goto LAB_00145243;
              } while (uVar18 != 0xffffffff);
              prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_00145243:
              uVar33 = lexer_00->lexsize - 2;
              lexer_00->lexsize = uVar33;
              lexer_00->lexbuf[uVar33] = '\0';
              lexer_00->state = LEX_CONTENT;
              break;
            }
            lexer_00->state = LEX_COMMENT;
            uVar33 = lexer_00->lexsize - 2;
            lexer_00->lexsize = uVar33;
          }
          else {
            if ((uVar18 & 0xffffffdf) == 0x44) {
              lexer_00->state = LEX_DOCTYPE;
              uVar18 = lexer_00->lexsize - 2;
              lexer_00->lexsize = uVar18;
              lexer_00->txtend = uVar18;
              do {
                uVar18 = prvTidyReadChar(doc->docIn);
                if ((uVar18 == 0xffffffff) || (uVar18 == 0x3e)) goto LAB_001451ab;
              } while ((0x7f < uVar18) || ((lexmap[uVar18] & 8) == 0));
              do {
                uVar18 = prvTidyReadChar(doc->docIn);
                if (((uVar18 == 0xffffffff) || (uVar18 == 0x3e)) || (0x7f < uVar18)) break;
              } while ((lexmap[uVar18] & 8) != 0);
LAB_001451ab:
              prvTidyUngetChar(uVar18,doc->docIn);
              if (lexer_00->txtstart < lexer_00->txtend) goto LAB_00145ef3;
              lexer_00->txtstart = lexer_00->lexsize;
              goto LAB_001447ac;
            }
            if (uVar18 != 0x5b) goto LAB_00145209;
            uVar33 = lexer_00->lexsize - 2;
            lexer_00->lexsize = uVar33;
            lexer_00->state = LEX_SECTION;
          }
        }
        else {
          if (uVar33 != 0x23) {
LAB_0014500d:
            if (((uVar33 < 0x80) && ((lexmap[uVar33] & 2) != 0)) ||
               ((*(int *)((doc->config).value + 0x67) != 0 &&
                (BVar20 = prvTidyIsXMLNamechar(uVar33), BVar20 != no)))) {
              prvTidyUngetChar(uVar33,doc->docIn);
              prvTidyUngetChar(0x3c,doc->docIn);
              uVar33 = lexer_00->lexsize - 2;
              lexer_00->lexsize = uVar33;
              lexer_00->txtend = uVar33;
              lexer_00->state = LEX_STARTTAG;
              if (lexer_00->txtstart < uVar33) goto LAB_00145ef3;
            }
            else {
              prvTidyUngetChar(uVar33,doc->docIn);
              lexer_00->lexsize = lexer_00->lexsize - 1;
              lexer_00->state = LEX_CONTENT;
              lexer_00->waswhite = no;
            }
            break;
          }
          uVar33 = lexer_00->lexsize - 2;
          lexer_00->lexsize = uVar33;
          lexer_00->state = LEX_JSTE;
        }
      }
      else if (uVar33 == 0x25) {
        uVar33 = lexer_00->lexsize - 2;
        lexer_00->lexsize = uVar33;
        lexer_00->state = LEX_ASP;
      }
      else {
        if (uVar33 != 0x3f) goto LAB_0014500d;
        uVar33 = lexer_00->lexsize - 2;
        lexer_00->lexsize = uVar33;
        lexer_00->state = LEX_PROCINSTR;
      }
      lexer_00->txtend = uVar33;
      if (lexer_00->txtstart < uVar33) {
LAB_00145ef3:
        pNVar23 = prvTidyTextToken(lexer_00);
        goto LAB_00144272;
      }
      lexer_00->txtstart = uVar33;
    }
    break;
  case LEX_ENDTAG:
    lexer_00->txtstart = lexer_00->lexsize - 1;
    piVar2 = &doc->docIn->curcol;
    *piVar2 = *piVar2 + 2;
    tVar17 = ParseTagName(doc);
    pNVar24 = TagToken(doc,EndTag);
    lexer_00->token = pNVar24;
    lexer_00->txtend = lexer_00->txtstart;
    lexer_00->lexsize = lexer_00->txtstart;
    uVar18 = (uint)tVar17;
    while (uVar18 != 0xffffffff) {
      if (uVar18 == 0x3e) {
        lexer_00->state = LEX_CONTENT;
        lexer_00->waswhite = no;
        goto LAB_0014531b;
      }
      uVar18 = prvTidyReadChar(doc->docIn);
    }
    prvTidyFreeNode(doc,lexer_00->token);
    break;
  case LEX_STARTTAG:
    uVar18 = prvTidyReadChar(doc->docIn);
    if (lexer_00->lexsize == 0) {
      uVar18 = 0xffffffff;
    }
    else {
      lexer_00->lexbuf[lexer_00->lexsize - 1] = (tmbchar)uVar18;
      uVar18 = lexer_00->lexsize - 1;
    }
    lexer_00->txtstart = uVar18;
    tVar17 = ParseTagName(doc);
    local_70._28_4_ = 0;
    pNVar23 = TagToken(doc,StartTag);
    lexer_00->token = pNVar23;
    if (tVar17 == '>') {
      pAVar31 = (AttVal *)0x0;
    }
    else {
      if (tVar17 == '/') {
        prvTidyUngetChar(0x2f,doc->docIn);
      }
      pAVar31 = ParseAttrs(doc,(Bool *)(local_70 + 0x1c));
      pNVar23 = lexer_00->token;
      if (local_70._28_4_ != 0) {
        pNVar23->type = StartEndTag;
      }
    }
    pNVar23->attributes = pAVar31;
    lexer_00->txtend = lexer_00->txtstart;
    lexer_00->lexsize = lexer_00->txtstart;
    pDVar15 = pNVar23->tag;
    if (pDVar15 == (Dict *)0x0) {
      if (mode != Preformatted) {
        if (pNVar23->type == StartTag) goto LAB_00145f10;
        BVar20 = no;
        goto LAB_00145f55;
      }
      lexer_00->waswhite = no;
      lexer_00->state = LEX_CONTENT;
    }
    else {
      TVar12 = pDVar15->id;
      GVar16 = Preformatted;
      if ((((TVar12 == TidyTag_PRE || mode == Preformatted) ||
           (GVar16 = mode, pNVar23->type != StartTag)) || ((pDVar15->model & 1) != 0)) &&
         ((mode = GVar16, TVar12 != TidyTag_HR && (TVar12 != TidyTag_BR)))) {
        BVar20 = no;
      }
      else {
LAB_00145f10:
        uVar18 = prvTidyReadChar(doc->docIn);
        if ((mode != IgnoreWhitespace && uVar18 == 10) ||
           ((BVar20 = yes, uVar18 != 10 && (uVar18 != 0xc)))) {
          prvTidyUngetChar(uVar18,doc->docIn);
          BVar20 = yes;
        }
      }
LAB_00145f55:
      lexer_00->waswhite = BVar20;
      lexer_00->state = LEX_CONTENT;
      pNVar23 = lexer_00->token;
      if (pNVar23->tag != (Dict *)0x0) {
        bVar38 = *(int *)((doc->config).value + 0x67) == 0;
        if (bVar38) {
          puVar1 = &doc->lexer->versions;
          *puVar1 = *puVar1 & (pNVar23->tag->versions | 0xe000);
        }
        prvTidyRepairDuplicateAttributes(doc,pNVar23,(uint)!bVar38);
        goto LAB_0014531b;
      }
      if (mode == OtherNamespace) goto LAB_0014531b;
    }
    if ((doc->lexer->doctype & 0x60000) == 0) {
LAB_00145fb9:
      uVar18 = 0x28c;
    }
    else {
      BVar20 = prvTidyelementIsAutonomousCustomFormat(pNVar23->element);
      pNVar23 = lexer_00->token;
      if (BVar20 == no) goto LAB_00145fb9;
      uVar18 = 0x28b;
    }
    prvTidyReport(doc,(Node *)0x0,pNVar23,uVar18);
    goto LAB_0014531b;
  case LEX_COMMENT:
    if (uVar33 == 0x2d) {
      uVar18 = prvTidyReadChar(doc->docIn);
      if ((uVar18 != 0x2d & bVar38) == 1) {
        if (lexer_00->lexsize - lexer_00->txtstart == 1) {
          lexer_00->lexbuf[lexer_00->lexsize - 1] = '=';
        }
        prvTidyAddCharToLexer(lexer_00,uVar18);
      }
      else {
        prvTidyAddCharToLexer(lexer_00,uVar18);
        if (uVar18 == 0x2d) {
          uVar18 = prvTidyReadChar(doc->docIn);
          if (uVar18 != 0x3e) {
            do {
              if (local_78 == 0) {
                iVar19 = doc->docIn->curcol;
                lexer_00->lines = doc->docIn->curline;
                lexer_00->columns = iVar19 - 3;
              }
              local_78 = local_78 + 1;
              if (bVar38 == false) {
                if (uVar18 != 0x2d) goto LAB_00145127;
              }
              else {
                lexer_00->lexbuf[lexer_00->lexsize - 2] = '=';
                if (uVar18 != 0x2d) goto LAB_0014511a;
              }
              prvTidyAddCharToLexer(lexer_00,0x2d);
              uVar18 = prvTidyReadChar(doc->docIn);
              if (uVar18 == 0x3e) break;
            } while( true );
          }
          if (local_78 != 0) {
            uVar33 = prvTidyHTMLVersion(doc);
            if ((uVar33 >> 0x11 & 1) == 0) {
              uVar18 = (uint)(bVar38 ^ 1U) + (uint)(bVar38 ^ 1U) * 2 + 0x24f;
            }
            else {
              uVar18 = 0x24f;
              if (bVar38 == false) goto LAB_00145a8e;
            }
            prvTidyReport(doc,(Node *)0x0,(Node *)0x0,uVar18);
          }
LAB_00145a8e:
          uVar33 = lexer_00->lexsize - 2;
          lexer_00->lexsize = uVar33;
          lexer_00->txtend = uVar33;
          lexer_00->lexbuf[uVar33] = '\0';
          lexer_00->state = LEX_CONTENT;
          lexer_00->waswhite = no;
          pLVar37 = doc->lexer;
          pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
          pNVar23->parent = (Node *)0x0;
          pNVar23->prev = (Node *)0x0;
          pNVar23->next = (Node *)0x0;
          pNVar23->content = (Node *)0x0;
          pNVar23->last = (Node *)0x0;
          pNVar23->attributes = (AttVal *)0x0;
          pNVar23->was = (Dict *)0x0;
          pNVar23->tag = (Dict *)0x0;
          pNVar23->element = (tmbstr)0x0;
          pNVar23->start = 0;
          pNVar23->end = 0;
          pNVar23->type = RootNode;
          pNVar23->line = 0;
          pNVar23->column = 0;
          pNVar23->idx = 0;
          pNVar23->closed = no;
          pNVar23->implicit = no;
          pNVar23->linebreak = no;
          *(undefined4 *)&pNVar23->field_0x6c = 0;
          uVar18 = pLVar37->columns;
          pNVar23->line = pLVar37->lines;
          pNVar23->column = uVar18;
          pNVar23->type = CommentTag;
          uVar18 = pLVar37->txtend;
          pNVar23->start = pLVar37->txtstart;
          pNVar23->end = uVar18;
          lexer_00->token = pNVar23;
          uVar18 = prvTidyReadChar(doc->docIn);
          if (uVar18 == 10) {
            pNVar23 = lexer_00->token;
            pNVar23->linebreak = yes;
            return pNVar23;
          }
          prvTidyUngetChar(uVar18,doc->docIn);
          goto LAB_0014531b;
        }
      }
    }
    break;
  case LEX_DOCTYPE:
    prvTidyUngetChar(uVar33,doc->docIn);
    lexer_00->lexsize = lexer_00->lexsize - 1;
    pLVar37 = doc->lexer;
    local_70._16_4_ = pLVar37->lexsize;
    local_70._8_8_ = (*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
    ((Node *)local_70._8_8_)->parent = (Node *)0x0;
    ((Node *)local_70._8_8_)->prev = (Node *)0x0;
    ((Node *)local_70._8_8_)->next = (Node *)0x0;
    ((Node *)local_70._8_8_)->content = (Node *)0x0;
    ((Node *)local_70._8_8_)->last = (Node *)0x0;
    ((Node *)local_70._8_8_)->attributes = (AttVal *)0x0;
    ((Node *)local_70._8_8_)->was = (Dict *)0x0;
    ((Node *)local_70._8_8_)->tag = (Dict *)0x0;
    ((Node *)local_70._8_8_)->element = (tmbstr)0x0;
    ((Node *)local_70._8_8_)->start = 0;
    ((Node *)local_70._8_8_)->end = 0;
    ((Node *)local_70._8_8_)->type = RootNode;
    ((Node *)local_70._8_8_)->line = 0;
    ((Node *)local_70._8_8_)->column = 0;
    ((Node *)local_70._8_8_)->idx = 0;
    ((Node *)local_70._8_8_)->closed = no;
    ((Node *)local_70._8_8_)->implicit = no;
    ((Node *)local_70._8_8_)->linebreak = no;
    *(undefined4 *)&((Node *)local_70._8_8_)->field_0x6c = 0;
    uVar18 = pLVar37->columns;
    ((Node *)local_70._8_8_)->line = pLVar37->lines;
    ((Node *)local_70._8_8_)->column = uVar18;
    ((Node *)local_70._8_8_)->type = DocTypeTag;
    uVar18 = pLVar37->txtend;
    ((Node *)local_70._8_8_)->start = pLVar37->txtstart;
    ((Node *)local_70._8_8_)->end = uVar18;
    pLVar37->waswhite = no;
    uVar18 = prvTidyReadChar(doc->docIn);
    if (uVar18 == 0xffffffff) goto LAB_0014596f;
    local_70._24_4_ = 0;
    iVar19 = 1;
    local_48 = 1;
    unique0x100032ef = pLVar37;
    goto LAB_001455e9;
  case LEX_PROCINSTR:
    uVar35 = (ulong)lexer_00->txtstart;
    uVar18 = lexer_00->lexsize;
    if (uVar18 - lexer_00->txtstart == 3) {
      iVar19 = prvTidytmbstrncmp(lexer_00->lexbuf + uVar35,"php",3);
      if (iVar19 == 0) {
        lexer_00->state = LEX_PHP;
        break;
      }
      uVar35 = (ulong)lexer_00->txtstart;
      uVar18 = lexer_00->lexsize;
    }
    if ((((uVar18 - (int)uVar35 == 4) &&
         (iVar19 = prvTidytmbstrncmp(lexer_00->lexbuf + uVar35,"xml",3), iVar19 == 0)) &&
        (-1 < (long)lexer_00->lexbuf[lexer_00->txtstart + 3])) &&
       ((lexmap[lexer_00->lexbuf[lexer_00->txtstart + 3]] & 8) != 0)) {
      lexer_00->state = LEX_XMLDECL;
      local_70._0_8_ = (AttVal *)0x0;
    }
    else {
      if ((*(int *)((doc->config).value + 0x65) != 0) || (lexer_00->isvoyager != no)) {
        if (uVar33 != 0x3f) break;
        uVar33 = prvTidyReadChar(doc->docIn);
        if (uVar33 == 0xffffffff) {
          prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x284);
          pSVar34 = doc->docIn;
          uVar18 = 0xffffffff;
          goto LAB_00144f43;
        }
        prvTidyAddCharToLexer(lexer_00,uVar33);
      }
      if (uVar33 == 0x3e) {
        uVar18 = lexer_00->lexsize;
        uVar33 = uVar18 - 1;
        lexer_00->lexsize = uVar33;
        if (uVar33 == 0) {
          lexer_00->txtend = 0;
          *lexer_00->lexbuf = '\0';
          pLVar37 = doc->lexer;
          pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
          pNVar23->parent = (Node *)0x0;
          pNVar23->prev = (Node *)0x0;
          pNVar23->next = (Node *)0x0;
          pNVar23->content = (Node *)0x0;
          pNVar23->last = (Node *)0x0;
          pNVar23->attributes = (AttVal *)0x0;
          pNVar23->was = (Dict *)0x0;
          pNVar23->tag = (Dict *)0x0;
          pNVar23->element = (tmbstr)0x0;
          pNVar23->start = 0;
          pNVar23->end = 0;
          pNVar23->type = RootNode;
          pNVar23->line = 0;
          pNVar23->column = 0;
          pNVar23->idx = 0;
          pNVar23->closed = no;
          pNVar23->implicit = no;
          pNVar23->linebreak = no;
          *(undefined4 *)&pNVar23->field_0x6c = 0;
          uVar18 = pLVar37->columns;
          pNVar23->line = pLVar37->lines;
          pNVar23->column = uVar18;
          pNVar23->type = ProcInsTag;
          uVar18 = pLVar37->txtend;
          pNVar23->start = pLVar37->txtstart;
          pNVar23->end = uVar18;
          lexer_00->token = pNVar23;
          goto LAB_0014610a;
        }
        uVar21 = lexer_00->txtstart;
        uVar35 = 0;
        ptVar25 = lexer_00->lexbuf;
        if (uVar33 == uVar21) goto LAB_00146065;
        uVar35 = (ulong)((uVar33 - uVar21) + (uint)(uVar33 - uVar21 == 0));
        uVar36 = 0;
        goto LAB_00145e3a;
      }
    }
    break;
  case LEX_CDATA:
    if (uVar33 != 0x5d) break;
    uVar18 = prvTidyReadChar(doc->docIn);
    pSVar34 = doc->docIn;
    if (uVar18 == 0x5d) {
      uVar18 = prvTidyReadChar(pSVar34);
      if (uVar18 != 0x3e) {
        prvTidyUngetChar(uVar18,doc->docIn);
        pSVar34 = doc->docIn;
        uVar18 = 0x5d;
        goto LAB_00144f43;
      }
      uVar33 = lexer_00->lexsize - 1;
      lexer_00->lexsize = uVar33;
      lexer_00->txtend = uVar33;
      lexer_00->lexbuf[uVar33] = '\0';
      lexer_00->state = LEX_CONTENT;
      lexer_00->waswhite = no;
      pLVar37 = doc->lexer;
      pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
      pNVar23->parent = (Node *)0x0;
      pNVar23->prev = (Node *)0x0;
      pNVar23->next = (Node *)0x0;
      pNVar23->content = (Node *)0x0;
      pNVar23->last = (Node *)0x0;
      pNVar23->attributes = (AttVal *)0x0;
      pNVar23->was = (Dict *)0x0;
      pNVar23->tag = (Dict *)0x0;
      pNVar23->element = (tmbstr)0x0;
      pNVar23->start = 0;
      pNVar23->end = 0;
      pNVar23->type = RootNode;
      pNVar23->line = 0;
      pNVar23->column = 0;
      pNVar23->idx = 0;
      pNVar23->closed = no;
      pNVar23->implicit = no;
      pNVar23->linebreak = no;
      *(undefined4 *)&pNVar23->field_0x6c = 0;
      uVar18 = pLVar37->columns;
      pNVar23->line = pLVar37->lines;
      pNVar23->column = uVar18;
      pNVar23->type = CDATATag;
      goto LAB_0014539f;
    }
    goto LAB_00144f43;
  case LEX_SECTION:
    if (uVar33 == 0x3e) {
      prvTidyUngetChar(0x3e,doc->docIn);
    }
    else if (uVar33 != 0x5d) {
      if (((uVar33 == 0x5b) && (lexer_00->lexsize == lexer_00->txtstart + 6)) &&
         (iVar19 = prvTidytmbstrncmp(lexer_00->lexbuf + lexer_00->txtstart,"CDATA[",6), iVar19 == 0)
         ) {
        lexer_00->state = LEX_CDATA;
        lexer_00->lexsize = lexer_00->lexsize - 6;
      }
      break;
    }
    uVar18 = prvTidyReadChar(doc->docIn);
    if (uVar18 == 0x2d) {
      uVar18 = prvTidyReadChar(doc->docIn);
      pSVar34 = doc->docIn;
      if (uVar18 == 0x2d) {
        uVar18 = prvTidyReadChar(pSVar34);
        if (uVar18 == 0x3e) goto LAB_00145cff;
        prvTidyUngetChar(uVar18,doc->docIn);
        pSVar34 = doc->docIn;
        uVar18 = 0x2d;
      }
      prvTidyUngetChar(uVar18,pSVar34);
      pSVar34 = doc->docIn;
      uVar18 = 0x2d;
      goto LAB_00144f43;
    }
    if (uVar18 != 0x3e) goto LAB_00144f3a;
LAB_00145cff:
    uVar33 = lexer_00->lexsize - 1;
    lexer_00->lexsize = uVar33;
    lexer_00->txtend = uVar33;
    lexer_00->lexbuf[uVar33] = '\0';
    lexer_00->state = LEX_CONTENT;
    lexer_00->waswhite = no;
    pLVar37 = doc->lexer;
    pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
    pNVar23->parent = (Node *)0x0;
    pNVar23->prev = (Node *)0x0;
    pNVar23->next = (Node *)0x0;
    pNVar23->content = (Node *)0x0;
    pNVar23->last = (Node *)0x0;
    pNVar23->attributes = (AttVal *)0x0;
    pNVar23->was = (Dict *)0x0;
    pNVar23->tag = (Dict *)0x0;
    pNVar23->element = (tmbstr)0x0;
    pNVar23->start = 0;
    pNVar23->end = 0;
    pNVar23->type = RootNode;
    pNVar23->line = 0;
    pNVar23->column = 0;
    pNVar23->idx = 0;
    pNVar23->closed = no;
    pNVar23->implicit = no;
    pNVar23->linebreak = no;
    *(undefined4 *)&pNVar23->field_0x6c = 0;
    uVar18 = pLVar37->columns;
    pNVar23->line = pLVar37->lines;
    pNVar23->column = uVar18;
    pNVar23->type = SectionTag;
    goto LAB_0014539f;
  case LEX_ASP:
    if (uVar33 == 0x25) {
      uVar18 = prvTidyReadChar(doc->docIn);
      if (uVar18 != 0x3e) goto LAB_00144f3a;
      uVar33 = lexer_00->lexsize - 1;
      lexer_00->lexsize = uVar33;
      lexer_00->txtend = uVar33;
      lexer_00->lexbuf[uVar33] = '\0';
      lexer_00->state = LEX_CONTENT;
      lexer_00->waswhite = no;
      pLVar37 = doc->lexer;
      pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
      pNVar23->parent = (Node *)0x0;
      pNVar23->prev = (Node *)0x0;
      pNVar23->next = (Node *)0x0;
      pNVar23->content = (Node *)0x0;
      pNVar23->last = (Node *)0x0;
      pNVar23->attributes = (AttVal *)0x0;
      pNVar23->was = (Dict *)0x0;
      pNVar23->tag = (Dict *)0x0;
      pNVar23->element = (tmbstr)0x0;
      pNVar23->start = 0;
      pNVar23->end = 0;
      pNVar23->type = RootNode;
      pNVar23->line = 0;
      pNVar23->column = 0;
      pNVar23->idx = 0;
      pNVar23->closed = no;
      pNVar23->implicit = no;
      pNVar23->linebreak = no;
      *(undefined4 *)&pNVar23->field_0x6c = 0;
      uVar18 = pLVar37->columns;
      pNVar23->line = pLVar37->lines;
      pNVar23->column = uVar18;
      pNVar23->type = AspTag;
      goto LAB_0014539f;
    }
    break;
  case LEX_JSTE:
    if (uVar33 == 0x23) {
      uVar18 = prvTidyReadChar(doc->docIn);
      if (uVar18 != 0x3e) goto LAB_00144f3a;
      uVar33 = lexer_00->lexsize - 1;
      lexer_00->lexsize = uVar33;
      lexer_00->txtend = uVar33;
      lexer_00->lexbuf[uVar33] = '\0';
      lexer_00->state = LEX_CONTENT;
      lexer_00->waswhite = no;
      pLVar37 = doc->lexer;
      pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
      pNVar23->parent = (Node *)0x0;
      pNVar23->prev = (Node *)0x0;
      pNVar23->next = (Node *)0x0;
      pNVar23->content = (Node *)0x0;
      pNVar23->last = (Node *)0x0;
      pNVar23->attributes = (AttVal *)0x0;
      pNVar23->was = (Dict *)0x0;
      pNVar23->tag = (Dict *)0x0;
      pNVar23->element = (tmbstr)0x0;
      pNVar23->start = 0;
      pNVar23->end = 0;
      pNVar23->type = RootNode;
      pNVar23->line = 0;
      pNVar23->column = 0;
      pNVar23->idx = 0;
      pNVar23->closed = no;
      pNVar23->implicit = no;
      pNVar23->linebreak = no;
      *(undefined4 *)&pNVar23->field_0x6c = 0;
      uVar18 = pLVar37->columns;
      pNVar23->line = pLVar37->lines;
      pNVar23->column = uVar18;
      pNVar23->type = JsteTag;
      goto LAB_0014539f;
    }
    break;
  case LEX_PHP:
    if (uVar33 == 0x3f) {
      uVar18 = prvTidyReadChar(doc->docIn);
      if (uVar18 != 0x3e) goto LAB_00144f3a;
      uVar33 = lexer_00->lexsize - 1;
      lexer_00->lexsize = uVar33;
      lexer_00->txtend = uVar33;
      lexer_00->lexbuf[uVar33] = '\0';
      lexer_00->state = LEX_CONTENT;
      lexer_00->waswhite = no;
      pLVar37 = doc->lexer;
      pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
      pNVar23->parent = (Node *)0x0;
      pNVar23->prev = (Node *)0x0;
      pNVar23->next = (Node *)0x0;
      pNVar23->content = (Node *)0x0;
      pNVar23->last = (Node *)0x0;
      pNVar23->attributes = (AttVal *)0x0;
      pNVar23->was = (Dict *)0x0;
      pNVar23->tag = (Dict *)0x0;
      pNVar23->element = (tmbstr)0x0;
      pNVar23->start = 0;
      pNVar23->end = 0;
      pNVar23->type = RootNode;
      pNVar23->line = 0;
      pNVar23->column = 0;
      pNVar23->idx = 0;
      pNVar23->closed = no;
      pNVar23->implicit = no;
      pNVar23->linebreak = no;
      *(undefined4 *)&pNVar23->field_0x6c = 0;
      uVar18 = pLVar37->columns;
      pNVar23->line = pLVar37->lines;
      pNVar23->column = uVar18;
      pNVar23->type = PhpTag;
      goto LAB_0014539f;
    }
    break;
  case LEX_XMLDECL:
    if (uVar33 < 0x80) {
      if ((uVar33 != 0x3f) && ((lexmap[uVar33] & 8) != 0)) break;
      if (uVar33 != 0x3f) goto LAB_00144af7;
    }
    else {
LAB_00144af7:
      local_44 = 0;
      local_70._28_4_ = 0;
      prvTidyUngetChar(uVar33,doc->docIn);
      ptVar25 = ParseAttribute(doc,(Bool *)(local_70 + 0x1c),&local_38,&local_40);
      pNVar24 = local_38;
      if (ptVar25 == (tmbstr)0x0) {
        if (local_38 != (Node *)0x0) {
          pAVar26 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
          pAVar26->asp = (Node *)0x0;
          pAVar26->php = (Node *)0x0;
          pAVar26->next = (AttVal *)0x0;
          pAVar26->dict = (Attribute *)0x0;
          pAVar26->delim = 0;
          *(undefined4 *)&pAVar26->field_0x24 = 0;
          pAVar26->attribute = (tmbstr)0x0;
          pAVar26->value = (tmbstr)0x0;
          pAVar26->asp = pNVar24;
          pAVar31 = (AttVal *)local_70._0_8_;
          pAVar32 = (AttVal *)local_70;
          while (pAVar29 = pAVar31, pAVar29 != (AttVal *)0x0) {
            pAVar32 = pAVar29;
            pAVar31 = pAVar29->next;
          }
          pAVar32->next = pAVar26;
        }
        pNVar23 = local_40;
        if (local_40 != (Node *)0x0) {
          pAVar26 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
          pAVar26->asp = (Node *)0x0;
          pAVar26->php = (Node *)0x0;
          pAVar26->next = (AttVal *)0x0;
          pAVar26->dict = (Attribute *)0x0;
          pAVar26->delim = 0;
          *(undefined4 *)&pAVar26->field_0x24 = 0;
          pAVar26->attribute = (tmbstr)0x0;
          pAVar26->value = (tmbstr)0x0;
          pAVar26->php = pNVar23;
          pAVar31 = (AttVal *)local_70._0_8_;
          pAVar32 = (AttVal *)local_70;
          while (pAVar29 = pAVar31, pAVar29 != (AttVal *)0x0) {
            pAVar32 = pAVar29;
            pAVar31 = pAVar29->next;
          }
          pAVar32->next = pAVar26;
        }
        lexer_00->lexsize = lexer_00->lexsize - 1;
        lexer_00->txtend = lexer_00->txtstart;
        lexer_00->lexbuf[lexer_00->txtstart] = '\0';
        lexer_00->state = LEX_CONTENT;
        lexer_00->waswhite = no;
        pLVar37 = doc->lexer;
        pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
        pNVar23->parent = (Node *)0x0;
        pNVar23->prev = (Node *)0x0;
        pNVar23->next = (Node *)0x0;
        pNVar23->content = (Node *)0x0;
        pNVar23->last = (Node *)0x0;
        pNVar23->attributes = (AttVal *)0x0;
        pNVar23->was = (Dict *)0x0;
        pNVar23->tag = (Dict *)0x0;
        pNVar23->element = (tmbstr)0x0;
        pNVar23->start = 0;
        pNVar23->end = 0;
        pNVar23->type = RootNode;
        pNVar23->line = 0;
        pNVar23->column = 0;
        pNVar23->idx = 0;
        pNVar23->closed = no;
        pNVar23->implicit = no;
        pNVar23->linebreak = no;
        *(undefined4 *)&pNVar23->field_0x6c = 0;
        uVar18 = pLVar37->columns;
        pNVar23->line = pLVar37->lines;
        pNVar23->column = uVar18;
        pNVar23->type = XmlDecl;
        uVar18 = pLVar37->txtend;
        pNVar23->start = pLVar37->txtstart;
        pNVar23->end = uVar18;
        lexer_00->token = pNVar23;
        pNVar23->attributes = (AttVal *)local_70._0_8_;
      }
      else {
        pAVar26 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
        pAVar26->delim = 0;
        *(undefined4 *)&pAVar26->field_0x24 = 0;
        pAVar26->attribute = (tmbstr)0x0;
        pAVar26->next = (AttVal *)0x0;
        pAVar26->dict = (Attribute *)0x0;
        pAVar26->asp = (Node *)0x0;
        pAVar26->php = (Node *)0x0;
        pAVar26->value = (tmbstr)0x0;
        pAVar26->attribute = ptVar25;
        ptVar27 = ParseValue(doc,ptVar25,yes,(Bool *)(local_70 + 0x1c),&local_44);
        pAVar26->value = ptVar27;
        pAVar26->delim = local_44;
        pAVar28 = prvTidyFindAttribute(doc,pAVar26);
        pAVar26->dict = pAVar28;
        pAVar31 = (AttVal *)local_70._0_8_;
        pAVar32 = (AttVal *)local_70;
        while (pAVar29 = pAVar31, pAVar29 != (AttVal *)0x0) {
          pAVar32 = pAVar29;
          pAVar31 = pAVar29->next;
        }
        pAVar32->next = pAVar26;
      }
      if (ptVar25 == (tmbstr)0x0) {
        return pNVar23;
      }
    }
    uVar18 = prvTidyReadChar(doc->docIn);
    if (uVar18 == 0x3e) {
      lexer_00->lexsize = lexer_00->lexsize - 1;
      lexer_00->txtend = lexer_00->txtstart;
      lexer_00->lexbuf[lexer_00->txtstart] = '\0';
      lexer_00->state = LEX_CONTENT;
      lexer_00->waswhite = no;
      pLVar37 = doc->lexer;
      pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
      pNVar23->parent = (Node *)0x0;
      pNVar23->prev = (Node *)0x0;
      pNVar23->next = (Node *)0x0;
      pNVar23->content = (Node *)0x0;
      pNVar23->last = (Node *)0x0;
      pNVar23->attributes = (AttVal *)0x0;
      pNVar23->was = (Dict *)0x0;
      pNVar23->tag = (Dict *)0x0;
      pNVar23->element = (tmbstr)0x0;
      pNVar23->start = 0;
      pNVar23->end = 0;
      pNVar23->type = RootNode;
      pNVar23->line = 0;
      pNVar23->column = 0;
      pNVar23->idx = 0;
      pNVar23->closed = no;
      pNVar23->implicit = no;
      pNVar23->linebreak = no;
      *(undefined4 *)&pNVar23->field_0x6c = 0;
      uVar18 = pLVar37->columns;
      pNVar23->line = pLVar37->lines;
      pNVar23->column = uVar18;
      pNVar23->type = XmlDecl;
      uVar18 = pLVar37->txtend;
      pNVar23->start = pLVar37->txtstart;
      pNVar23->end = uVar18;
      lexer_00->token = pNVar23;
      pNVar23->attributes = (AttVal *)local_70._0_8_;
      return pNVar23;
    }
LAB_00144f3a:
    pSVar34 = doc->docIn;
LAB_00144f43:
    prvTidyUngetChar(uVar18,pSVar34);
  }
switchD_00144749_default:
  uVar33 = prvTidyReadChar(doc->docIn);
  if (uVar33 == 0xffffffff) goto LAB_00145260;
  goto LAB_001446ee;
LAB_00145e3a:
  if ((-1 < (long)ptVar25[uVar21 + (int)uVar36]) &&
     ((lexmap[ptVar25[uVar21 + (int)uVar36]] & 8) != 0)) {
    uVar35 = uVar36 & 0xffffffff;
    goto LAB_00146065;
  }
  uVar36 = uVar36 + 1;
  if (uVar35 == uVar36) {
LAB_00146065:
    uVar22 = uVar18 - 2;
    uVar36 = (ulong)uVar22;
    cVar11 = ptVar25[uVar36];
    if (cVar11 == '?') {
      lexer_00->lexsize = uVar22;
      uVar33 = uVar22;
    }
    else {
      uVar36 = (ulong)uVar33;
    }
    lexer_00->txtstart = uVar21 + (uint)uVar35;
    lexer_00->txtend = uVar33;
    ptVar25[uVar36] = '\0';
    pLVar37 = doc->lexer;
    pNVar23 = (Node *)(*pLVar37->allocator->vtbl->alloc)(pLVar37->allocator,0x70);
    pNVar23->parent = (Node *)0x0;
    pNVar23->prev = (Node *)0x0;
    pNVar23->next = (Node *)0x0;
    pNVar23->content = (Node *)0x0;
    pNVar23->last = (Node *)0x0;
    pNVar23->attributes = (AttVal *)0x0;
    pNVar23->was = (Dict *)0x0;
    pNVar23->tag = (Dict *)0x0;
    pNVar23->element = (tmbstr)0x0;
    pNVar23->start = 0;
    pNVar23->end = 0;
    pNVar23->type = RootNode;
    pNVar23->line = 0;
    pNVar23->column = 0;
    pNVar23->idx = 0;
    pNVar23->closed = no;
    pNVar23->implicit = no;
    pNVar23->linebreak = no;
    *(undefined4 *)&pNVar23->field_0x6c = 0;
    uVar18 = pLVar37->columns;
    pNVar23->line = pLVar37->lines;
    pNVar23->column = uVar18;
    pNVar23->type = ProcInsTag;
    uVar18 = pLVar37->txtend;
    pNVar23->start = pLVar37->txtstart;
    pNVar23->end = uVar18;
    lexer_00->token = pNVar23;
    pNVar23->closed = (uint)(cVar11 == '?');
    ptVar25 = prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + (lexer_00->txtstart - uVar35),
                                (uint)uVar35);
    pNVar23 = lexer_00->token;
    pNVar23->element = ptVar25;
LAB_0014610a:
    lexer_00->state = LEX_CONTENT;
    lexer_00->waswhite = no;
    return pNVar23;
  }
  goto LAB_00145e3a;
LAB_001455e9:
  pLVar37 = stack0xffffffffffffffb0;
  uVar33 = 0x20;
  if (uVar18 != 10) {
    uVar33 = uVar18;
  }
  uVar21 = uVar18;
  if (iVar19 != 4) {
    uVar21 = uVar33;
  }
  BVar20 = no;
  uVar22 = uVar21;
  if (((uVar21 < 0x80) && (iVar19 != 4)) && ((lexmap[uVar21] & 8) != 0)) {
    if (stack0xffffffffffffffb0->waswhite == no) {
      BVar20 = yes;
      uVar22 = uVar33;
      goto LAB_00145643;
    }
  }
  else {
LAB_00145643:
    prvTidyAddCharToLexer(stack0xffffffffffffffb0,uVar22);
    pLVar37->waswhite = BVar20;
    if (((uVar21 < 0x80) && ((lexmap[uVar33] & 8) != 0)) ||
       ((uVar18 == 0x5b || (iVar19 = 1, uVar18 == 0x3e)))) {
      ptVar25 = prvTidytmbstrndup(doc->allocator,pLVar37->lexbuf + (int)local_70._16_4_,
                                  ~local_70._16_4_ + pLVar37->lexsize);
      *(tmbstr *)(local_70._8_8_ + 0x40) = ptVar25;
      if ((uVar18 == 0x5b) || (iVar19 = 0, uVar18 == 0x3e)) {
        pLVar37->lexsize = pLVar37->lexsize - 1;
        prvTidyUngetChar(uVar18,doc->docIn);
        iVar19 = 0;
      }
    }
  }
  uVar18 = prvTidyReadChar(doc->docIn);
  if (uVar18 == 0xffffffff) {
LAB_0014596f:
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x253);
    prvTidyFreeNode(doc,(Node *)local_70._8_8_);
    lexer_00->token = (Node *)0x0;
    lexer_00->txtend = lexer_00->lexsize;
    lexer_00->lexbuf[lexer_00->lexsize] = '\0';
    lexer_00->state = LEX_CONTENT;
    lexer_00->waswhite = no;
    if (((lexer_00->doctype == 0) && (lexer_00->token != (Node *)0x0)) &&
       (*(int *)((doc->config).value + 0x67) == 0)) {
      uVar18 = FindGivenVersion(doc,lexer_00->token);
      lexer_00->doctype = uVar18;
      if (uVar18 != 0x60000) {
        prvTidyAdjustTags(doc);
      }
    }
LAB_0014531b:
    return lexer_00->token;
  }
  goto LAB_001455e9;
LAB_0014511a:
  lexer_00->lexbuf[lexer_00->lexsize - 1] = '=';
LAB_00145127:
  prvTidyAddCharToLexer(lexer_00,uVar18);
  goto switchD_00144749_default;
}

Assistant:

Node* TY_(GetToken)( TidyDocImpl* doc, GetTokenMode mode )
{
    Node *node;
    Lexer* lexer = doc->lexer;

    if (lexer->pushed || lexer->itoken)
    {
        /* Deal with previously returned duplicate inline token */
        if (lexer->itoken)
        {
            /* itoken rejected */
            if (lexer->pushed)
            {
                lexer->pushed = no;
                node = lexer->itoken;
                GTDBG(doc,"lex-itoken", node);
                return node;
            }
            /* itoken has been accepted */
            lexer->itoken = NULL;
        }
            
        /* duplicate inlines in preference to pushed text nodes when appropriate */
        lexer->pushed = no;
        if (lexer->token->type != TextNode
            || !(lexer->insert || lexer->inode)) {
            node = lexer->token;
            GTDBG(doc,"lex-token", node);
            return node;
        }
        lexer->itoken = TY_(InsertedToken)( doc );
        node = lexer->itoken;
        GTDBG(doc,"lex-inserted", node);
        return node;
    }

    assert( !(lexer->pushed || lexer->itoken) );

    /* at start of block elements, unclosed inline
       elements are inserted into the token stream 
       Issue #341 - Can NOT insert a token if NO istacksize  
     */
    if ((lexer->insert || lexer->inode) && lexer->istacksize)
    {
        /*\ Issue #92: could fix by the following, but instead chose not to stack these 2
         *  if ( !(lexer->insert && (nodeIsINS(lexer->insert) || nodeIsDEL(lexer->insert))) ) {
        \*/
        lexer->token = TY_(InsertedToken)( doc );
        node = lexer->token;
        GTDBG(doc,"lex-inserted2", node);
        return node;
    }

    if (mode == CdataContent)
    {
        assert( lexer->parent != NULL );
        node = GetCDATA(doc, lexer->parent);
        GTDBG(doc,"lex-cdata", node);
        return node;
    }

    return GetTokenFromStream( doc, mode );
}